

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
ftxui::CellToGlyphIndex(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *input)

{
  uint32_t ucs;
  bool bVar1;
  size_t start;
  iterator iVar2;
  uint32_t codepoint;
  size_t end;
  int local_48;
  uint32_t local_44;
  pointer *local_40;
  size_t local_38;
  
  local_48 = -1;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,input->_M_string_length);
  local_38 = 0;
  if (input->_M_string_length != 0) {
    local_40 = &(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    start = 0;
    do {
      local_44 = 0;
      bVar1 = EatCodePoint(input,start,&local_38,&local_44);
      start = local_38;
      ucs = local_44;
      if ((bVar1) && (local_44 != 0)) {
        bVar1 = local_44 - 0x7f < 0x21;
        if (local_44 < 0x20) {
          bVar1 = local_44 != 10;
        }
        if (!bVar1) {
          bVar1 = IsCombining(local_44);
          if (bVar1) {
            if (local_48 == -1) {
              local_48 = 0;
              iVar2._M_current =
                   (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0010cc7e;
              *iVar2._M_current = 0;
              goto LAB_0010cc70;
            }
          }
          else {
            bVar1 = IsFullWidth(ucs);
            local_48 = local_48 + 1;
            if (bVar1) {
              iVar2._M_current =
                   (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,&local_48
                          );
              }
              else {
                *iVar2._M_current = local_48;
                *local_40 = iVar2._M_current + 1;
              }
              iVar2._M_current =
                   (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
LAB_0010cc7e:
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,&local_48
                          );
                goto LAB_0010cc89;
              }
              *iVar2._M_current = local_48;
            }
            else {
              iVar2._M_current =
                   (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0010cc7e;
              *iVar2._M_current = local_48;
            }
LAB_0010cc70:
            *local_40 = iVar2._M_current + 1;
          }
        }
      }
LAB_0010cc89:
    } while (start < input->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> CellToGlyphIndex(const std::string& input) {
  int x = -1;
  std::vector<int> out;
  out.reserve(input.size());
  size_t start = 0;
  size_t end = 0;
  while (start < input.size()) {
    uint32_t codepoint = 0;
    const bool eaten = EatCodePoint(input, start, &end, &codepoint);
    start = end;

    // Ignore invalid / control characters.
    if (!eaten || IsControl(codepoint)) {
      continue;
    }

    // Combining characters are put with the previous glyph they are modifying.
    if (IsCombining(codepoint)) {
      if (x == -1) {
        ++x;
        out.push_back(x);
      }
      continue;
    }

    // Fullwidth characters take two cells. The second is made of the empty
    // string to reserve the space the first is taking.
    if (IsFullWidth(codepoint)) {
      ++x;
      out.push_back(x);
      out.push_back(x);
      continue;
    }

    // Normal characters:
    ++x;
    out.push_back(x);
  }
  return out;
}